

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int ARKodeSVtolerances(void *arkode_mem,sunrealtype reltol,N_Vector abstol)

{
  int iVar1;
  long in_RSI;
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  ARKodeMem ark_mem_00;
  ARKodeMem ark_mem;
  sunrealtype abstolmin;
  N_Vector *in_stack_ffffffffffffffc8;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x136,"ARKodeSVtolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,0x13f,"ARKodeSVtolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"Attempt to call before ARKodeInit.");
    local_4 = -0x17;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if (in_RSI == 0) {
      arkProcessError(in_RDI,-0x16,0x14b,"ARKodeSVtolerances",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"abstol = NULL illegal.");
      local_4 = -0x16;
    }
    else if (*(long *)(*(long *)(in_RSI + 8) + 0xb8) == 0) {
      arkProcessError(in_RDI,-0x16,0x151,"ARKodeSVtolerances",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"Missing N_VMin routine from N_Vector");
      local_4 = -0x16;
    }
    else {
      ark_mem_00 = (ARKodeMem)N_VMin(in_RSI);
      if (0.0 <= (double)ark_mem_00) {
        in_RDI->atolmin0 = (uint)((double)ark_mem_00 == 0.0);
        if (in_RDI->VabstolMallocDone == 0) {
          iVar1 = arkAllocVec(ark_mem_00,(N_Vector)in_RDI,in_stack_ffffffffffffffc8);
          if (iVar1 == 0) {
            arkProcessError(in_RDI,-0x14,0x165,"ARKodeSVtolerances",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,"Allocation of arkode_mem failed.");
            return -0x16;
          }
          in_RDI->VabstolMallocDone = 1;
        }
        N_VScale(0x3ff0000000000000,in_RSI,in_RDI->Vabstol);
        in_RDI->reltol = in_XMM0_Qa;
        in_RDI->itol = 1;
        in_RDI->user_efun = 0;
        in_RDI->efun = arkEwtSetSV;
        in_RDI->e_data = in_RDI;
        local_4 = 0;
      }
      else {
        arkProcessError(in_RDI,-0x16,0x158,"ARKodeSVtolerances",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                        ,"abstol has negative component(s) (illegal).");
        local_4 = -0x16;
      }
    }
  }
  else {
    arkProcessError(in_RDI,-0x16,0x145,"ARKodeSVtolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"reltol < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int ARKodeSVtolerances(void* arkode_mem, sunrealtype reltol, N_Vector abstol)
{
  /* local variables */
  sunrealtype abstolmin;

  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check inputs */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }
  if (reltol < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_RELTOL);
    return (ARK_ILL_INPUT);
  }
  if (abstol == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_ABSTOL);
    return (ARK_ILL_INPUT);
  }
  if (abstol->ops->nvmin == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Missing N_VMin routine from N_Vector");
    return (ARK_ILL_INPUT);
  }
  abstolmin = N_VMin(abstol);
  if (abstolmin < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_ABSTOL);
    return (ARK_ILL_INPUT);
  }

  /* Set flag indicating whether min(abstol) == 0 */
  ark_mem->atolmin0 = (abstolmin == ZERO);

  /* Copy tolerances into memory */
  if (!(ark_mem->VabstolMallocDone))
  {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->Vabstol)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_ILL_INPUT);
    }
    ark_mem->VabstolMallocDone = SUNTRUE;
  }
  N_VScale(ONE, abstol, ark_mem->Vabstol);
  ark_mem->reltol = reltol;
  ark_mem->itol   = ARK_SV;

  /* enforce use of arkEwtSetSV */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->efun      = arkEwtSetSV;
  ark_mem->e_data    = ark_mem;

  return (ARK_SUCCESS);
}